

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

int uv_read_start(uv_stream_t *stream,uv_alloc_cb alloc_cb,uv_read_cb read_cb)

{
  uv_read_cb read_cb_local;
  uv_alloc_cb alloc_cb_local;
  uv_stream_t *stream_local;
  
  if (((stream == (uv_stream_t *)0x0) || (alloc_cb == (uv_alloc_cb)0x0)) ||
     (read_cb == (uv_read_cb)0x0)) {
    stream_local._4_4_ = -0x16;
  }
  else if ((stream->flags & 1) == 0) {
    if ((stream->flags & 0x1000) == 0) {
      if ((stream->flags & 0x4000) == 0) {
        stream_local._4_4_ = -0x6b;
      }
      else {
        stream_local._4_4_ = uv__read_start(stream,alloc_cb,read_cb);
      }
    }
    else {
      stream_local._4_4_ = -0x72;
    }
  }
  else {
    stream_local._4_4_ = -0x16;
  }
  return stream_local._4_4_;
}

Assistant:

int uv_read_start(uv_stream_t* stream,
                  uv_alloc_cb alloc_cb,
                  uv_read_cb read_cb) {
  if (stream == NULL || alloc_cb == NULL || read_cb == NULL)
    return UV_EINVAL;

  if (stream->flags & UV_HANDLE_CLOSING)
    return UV_EINVAL;

  if (stream->flags & UV_HANDLE_READING)
    return UV_EALREADY;

  if (!(stream->flags & UV_HANDLE_READABLE))
    return UV_ENOTCONN;

  return uv__read_start(stream, alloc_cb, read_cb);
}